

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O3

void gl4cts::CopyImage::Utils::makeTextureComplete
               (Context *context,GLenum target,GLuint id,GLint base_level,GLint max_level)

{
  int iVar1;
  GLenum GVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  uint uVar5;
  long lVar4;
  
  iVar1 = (*context->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  if (target == 0x8d41) {
    return;
  }
  GVar2 = transProxyToRealTarget(target);
  uVar5 = 0x8513;
  if (5 < GVar2 - 0x8515) {
    uVar5 = GVar2;
  }
  (**(code **)(lVar4 + 0xb8))(uVar5,id);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"BindTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                  ,0x554);
  if (uVar5 != 0x8c2a) {
    (**(code **)(lVar4 + 0x1360))(uVar5,0x813c,base_level);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"TexParameteri",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                    ,0x55a);
    (**(code **)(lVar4 + 0x1360))(uVar5,0x813d,max_level);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"TexParameteri",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                    ,0x55d);
    if ((uVar5 & 0xfffffffd) != 0x9100) {
      (**(code **)(lVar4 + 0x1360))(uVar5,0x2800,0x2600);
      if (uVar5 == 0x84f5) {
        (**(code **)(lVar4 + 0x1360))(0x84f5,0x2801,0x2600);
        iVar1 = 0x570;
      }
      else {
        (**(code **)(lVar4 + 0x1360))(uVar5,0x2801,0x2700);
        iVar1 = 0x56b;
      }
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"TexParameteri",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                      ,iVar1);
    }
  }
  (**(code **)(lVar4 + 0xb8))(uVar5,0);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"BindTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                  ,0x577);
  return;
}

Assistant:

void Utils::makeTextureComplete(deqp::Context& context, GLenum target, GLuint id, GLint base_level, GLint max_level)
{
	const Functions& gl = context.getRenderContext().getFunctions();

	if (GL_RENDERBUFFER == target)
	{
		return;
	}

	/* Translate proxies into real targets */
	target = transRealToBindTarget(transProxyToRealTarget(target));

	gl.bindTexture(target, id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

	/* Set levels */
	if (GL_TEXTURE_BUFFER != target)
	{
		gl.texParameteri(target, GL_TEXTURE_BASE_LEVEL, base_level);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexParameteri");

		gl.texParameteri(target, GL_TEXTURE_MAX_LEVEL, max_level);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexParameteri");

		/* Integer textures won't be complete with the default min filter
		 * of GL_NEAREST_MIPMAP_LINEAR (or GL_LINEAR for rectangle textures)
		 * and default mag filter of GL_LINEAR, so switch to nearest.
		 */
		if (GL_TEXTURE_2D_MULTISAMPLE != target &&
			GL_TEXTURE_2D_MULTISAMPLE_ARRAY != target)
		{
			gl.texParameteri(target, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			if (GL_TEXTURE_RECTANGLE != target)
			{
				gl.texParameteri(target, GL_TEXTURE_MIN_FILTER,
								 GL_NEAREST_MIPMAP_NEAREST);
				GLU_EXPECT_NO_ERROR(gl.getError(), "TexParameteri");
			}
			else
			{
				gl.texParameteri(target, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
				GLU_EXPECT_NO_ERROR(gl.getError(), "TexParameteri");
			}
		}
	}

	/* Clean binding point */
	gl.bindTexture(target, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");
}